

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadEffectProfileCommon(ColladaParser *this,Effect *pEffect)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  mapped_type *pmVar4;
  undefined4 extraout_var_00;
  mapped_type *pmVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined1 local_130 [8];
  aiColor4D dummy;
  char *opaque;
  size_type sStack_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_108;
  pointer local_f8;
  pointer puStack_f0;
  pointer local_e8;
  string sStack_e0;
  allocator local_b1;
  undefined1 local_b0 [8];
  string id;
  undefined1 auStack_88 [4];
  int attrID;
  string sStack_80;
  allocator local_41;
  undefined1 local_40 [8];
  string sid;
  int attrSID;
  Effect *pEffect_local;
  ColladaParser *this_local;
  
  do {
    do {
      while( true ) {
        uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((uVar2 & 1) == 0) {
          return;
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar3 != 1) break;
        bVar1 = IsElement(this,"newparam");
        if (bVar1) {
          sid.field_2._12_4_ = GetAttribute(this,"sid");
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])
                            (this->mReader,(ulong)(uint)sid.field_2._12_4_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_40,(char *)CONCAT44(extraout_var,iVar3),&local_41);
          std::allocator<char>::~allocator((allocator<char> *)&local_41);
          sStack_80._M_string_length = 0;
          sStack_80.field_2._M_allocated_capacity = 0;
          auStack_88 = (undefined1  [4])0x0;
          attrID = 0;
          sStack_80._M_dataplus = (_Alloc_hider)0x0;
          sStack_80._1_7_ = 0;
          sStack_80.field_2._8_8_ = 0;
          Collada::EffectParam::EffectParam((EffectParam *)auStack_88);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam>_>_>
                   ::operator[](&pEffect->mParams,(key_type *)local_40);
          Collada::EffectParam::operator=(pmVar4,(EffectParam *)auStack_88);
          Collada::EffectParam::~EffectParam((EffectParam *)auStack_88);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam>_>_>
                   ::operator[](&pEffect->mParams,(key_type *)local_40);
          ReadEffectParam(this,pmVar4);
          std::__cxx11::string::~string((string *)local_40);
        }
        else {
          bVar1 = IsElement(this,"technique");
          if ((!bVar1) && (bVar1 = IsElement(this,"extra"), !bVar1)) {
            if ((this->mFormat == FV_1_4_n) && (bVar1 = IsElement(this,"image"), bVar1)) {
              id.field_2._12_4_ = GetAttribute(this,"id");
              iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])
                                (this->mReader,(ulong)(uint)id.field_2._12_4_);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)local_b0,(char *)CONCAT44(extraout_var_00,iVar3),&local_b1);
              std::allocator<char>::~allocator((allocator<char> *)&local_b1);
              sStack_e0._M_string_length = 0;
              sStack_e0.field_2._M_allocated_capacity = 0;
              local_e8 = (pointer)0x0;
              sStack_e0._M_dataplus = (_Alloc_hider)0x0;
              sStack_e0._1_7_ = 0;
              local_f8 = (pointer)0x0;
              puStack_f0 = (pointer)0x0;
              local_108._M_allocated_capacity = 0;
              local_108._8_8_ = 0;
              opaque = (char *)0x0;
              sStack_110 = 0;
              sStack_e0.field_2._8_8_ = 0;
              Collada::Image::Image((Image *)&opaque);
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
                       ::operator[](&this->mImageLibrary,(key_type *)local_b0);
              Collada::Image::operator=(pmVar5,(Image *)&opaque);
              Collada::Image::~Image((Image *)&opaque);
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
                       ::operator[](&this->mImageLibrary,(key_type *)local_b0);
              ReadImage(this,pmVar5);
              std::__cxx11::string::~string((string *)local_b0);
            }
            else {
              bVar1 = IsElement(this,"phong");
              if (bVar1) {
                pEffect->mShadeType = Shade_Phong;
              }
              else {
                bVar1 = IsElement(this,"constant");
                if (bVar1) {
                  pEffect->mShadeType = Shade_Constant;
                }
                else {
                  bVar1 = IsElement(this,"lambert");
                  if (bVar1) {
                    pEffect->mShadeType = Shade_Lambert;
                  }
                  else {
                    bVar1 = IsElement(this,"blinn");
                    if (bVar1) {
                      pEffect->mShadeType = Shade_Blinn;
                    }
                    else {
                      bVar1 = IsElement(this,"emission");
                      if (bVar1) {
                        ReadEffectColor(this,&pEffect->mEmissive,&pEffect->mTexEmissive);
                      }
                      else {
                        bVar1 = IsElement(this,"ambient");
                        if (bVar1) {
                          ReadEffectColor(this,&pEffect->mAmbient,&pEffect->mTexAmbient);
                        }
                        else {
                          bVar1 = IsElement(this,"diffuse");
                          if (bVar1) {
                            ReadEffectColor(this,&pEffect->mDiffuse,&pEffect->mTexDiffuse);
                          }
                          else {
                            bVar1 = IsElement(this,"specular");
                            if (bVar1) {
                              ReadEffectColor(this,&pEffect->mSpecular,&pEffect->mTexSpecular);
                            }
                            else {
                              bVar1 = IsElement(this,"reflective");
                              if (bVar1) {
                                ReadEffectColor(this,&pEffect->mReflective,&pEffect->mTexReflective)
                                ;
                              }
                              else {
                                bVar1 = IsElement(this,"transparent");
                                if (bVar1) {
                                  pEffect->mHasTransparency = true;
                                  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[8])
                                                    (this->mReader,"opaque");
                                  dummy._8_8_ = CONCAT44(extraout_var_01,iVar3);
                                  iVar3 = strcmp((char *)dummy._8_8_,"RGB_ZERO");
                                  if ((iVar3 == 0) ||
                                     (iVar3 = strcmp((char *)dummy._8_8_,"RGB_ONE"), iVar3 == 0)) {
                                    pEffect->mRGBTransparency = true;
                                  }
                                  iVar3 = strcmp((char *)dummy._8_8_,"RGB_ZERO");
                                  if ((iVar3 == 0) ||
                                     (iVar3 = strcmp((char *)dummy._8_8_,"A_ZERO"), iVar3 == 0)) {
                                    pEffect->mInvertTransparency = true;
                                  }
                                  ReadEffectColor(this,&pEffect->mTransparent,
                                                  &pEffect->mTexTransparent);
                                }
                                else {
                                  bVar1 = IsElement(this,"shininess");
                                  if (bVar1) {
                                    ReadEffectFloat(this,&pEffect->mShininess);
                                  }
                                  else {
                                    bVar1 = IsElement(this,"reflectivity");
                                    if (bVar1) {
                                      ReadEffectFloat(this,&pEffect->mReflectivity);
                                    }
                                    else {
                                      bVar1 = IsElement(this,"transparency");
                                      if (bVar1) {
                                        ReadEffectFloat(this,&pEffect->mTransparency);
                                      }
                                      else {
                                        bVar1 = IsElement(this,"index_of_refraction");
                                        if (bVar1) {
                                          ReadEffectFloat(this,&pEffect->mRefractIndex);
                                        }
                                        else {
                                          bVar1 = IsElement(this,"double_sided");
                                          if (bVar1) {
                                            bVar1 = ReadBoolFromTextContent(this);
                                            pEffect->mDoubleSided = bVar1;
                                          }
                                          else {
                                            bVar1 = IsElement(this,"bump");
                                            if (bVar1) {
                                              aiColor4t<float>::aiColor4t
                                                        ((aiColor4t<float> *)local_130);
                                              ReadEffectColor(this,(aiColor4D *)local_130,
                                                              &pEffect->mTexBump);
                                            }
                                            else {
                                              bVar1 = IsElement(this,"wireframe");
                                              if (bVar1) {
                                                bVar1 = ReadBoolFromTextContent(this);
                                                pEffect->mWireframe = bVar1;
                                                TestClosing(this,"wireframe");
                                              }
                                              else {
                                                bVar1 = IsElement(this,"faceted");
                                                if (bVar1) {
                                                  bVar1 = ReadBoolFromTextContent(this);
                                                  pEffect->mFaceted = bVar1;
                                                  TestClosing(this,"faceted");
                                                }
                                                else {
                                                  SkipElement(this);
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar3 != 2);
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar3 = strcmp((char *)CONCAT44(extraout_var_02,iVar3),"profile_COMMON");
  } while (iVar3 != 0);
  return;
}

Assistant:

void ColladaParser::ReadEffectProfileCommon(Collada::Effect& pEffect)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("newparam")) {
                // save ID
                int attrSID = GetAttribute("sid");
                std::string sid = mReader->getAttributeValue(attrSID);
                pEffect.mParams[sid] = EffectParam();
                ReadEffectParam(pEffect.mParams[sid]);
            }
            else if (IsElement("technique") || IsElement("extra"))
            {
                // just syntactic sugar
            }

            else if (mFormat == FV_1_4_n && IsElement("image"))
            {
                // read ID. Another entry which is "optional" by design but obligatory in reality
                int attrID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(attrID);

                // create an entry and store it in the library under its ID
                mImageLibrary[id] = Image();

                // read on from there
                ReadImage(mImageLibrary[id]);
            }

            /* Shading modes */
            else if (IsElement("phong"))
                pEffect.mShadeType = Shade_Phong;
            else if (IsElement("constant"))
                pEffect.mShadeType = Shade_Constant;
            else if (IsElement("lambert"))
                pEffect.mShadeType = Shade_Lambert;
            else if (IsElement("blinn"))
                pEffect.mShadeType = Shade_Blinn;

            /* Color + texture properties */
            else if (IsElement("emission"))
                ReadEffectColor(pEffect.mEmissive, pEffect.mTexEmissive);
            else if (IsElement("ambient"))
                ReadEffectColor(pEffect.mAmbient, pEffect.mTexAmbient);
            else if (IsElement("diffuse"))
                ReadEffectColor(pEffect.mDiffuse, pEffect.mTexDiffuse);
            else if (IsElement("specular"))
                ReadEffectColor(pEffect.mSpecular, pEffect.mTexSpecular);
            else if (IsElement("reflective")) {
                ReadEffectColor(pEffect.mReflective, pEffect.mTexReflective);
            }
            else if (IsElement("transparent")) {
                pEffect.mHasTransparency = true;

                const char* opaque = mReader->getAttributeValueSafe("opaque");

                if (::strcmp(opaque, "RGB_ZERO") == 0 || ::strcmp(opaque, "RGB_ONE") == 0) {
                    pEffect.mRGBTransparency = true;
                }

                // In RGB_ZERO mode, the transparency is interpreted in reverse, go figure...
                if (::strcmp(opaque, "RGB_ZERO") == 0 || ::strcmp(opaque, "A_ZERO") == 0) {
                    pEffect.mInvertTransparency = true;
                }

                ReadEffectColor(pEffect.mTransparent, pEffect.mTexTransparent);
            }
            else if (IsElement("shininess"))
                ReadEffectFloat(pEffect.mShininess);
            else if (IsElement("reflectivity"))
                ReadEffectFloat(pEffect.mReflectivity);

            /* Single scalar properties */
            else if (IsElement("transparency"))
                ReadEffectFloat(pEffect.mTransparency);
            else if (IsElement("index_of_refraction"))
                ReadEffectFloat(pEffect.mRefractIndex);

            // GOOGLEEARTH/OKINO extensions
            // -------------------------------------------------------
            else if (IsElement("double_sided"))
                pEffect.mDoubleSided = ReadBoolFromTextContent();

            // FCOLLADA extensions
            // -------------------------------------------------------
            else if (IsElement("bump")) {
                aiColor4D dummy;
                ReadEffectColor(dummy, pEffect.mTexBump);
            }

            // MAX3D extensions
            // -------------------------------------------------------
            else if (IsElement("wireframe")) {
                pEffect.mWireframe = ReadBoolFromTextContent();
                TestClosing("wireframe");
            }
            else if (IsElement("faceted")) {
                pEffect.mFaceted = ReadBoolFromTextContent();
                TestClosing("faceted");
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "profile_COMMON") == 0)
            {
                break;
            }
        }
    }
}